

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O1

int run_test_tcp_close(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar3;
  uv_tcp_t *puVar4;
  undefined8 unaff_RBX;
  int iVar5;
  uv_tcp_t *puVar6;
  uv_tcp_t *__ptr;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  undefined1 auStack_158 [16];
  undefined8 uStack_148;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [248];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_120);
  if (iVar1 == 0) {
    unaff_RBX = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_110);
    if (iVar1 != 0) goto LAB_001715ab;
    iVar1 = uv_tcp_init(unaff_RBX,local_100);
    if (iVar1 != 0) goto LAB_001715b0;
    iVar1 = uv_tcp_bind(local_100,local_110,0);
    if (iVar1 != 0) goto LAB_001715b5;
    iVar1 = uv_listen(local_100,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_001715ba;
    uv_unref(local_100);
    iVar1 = uv_tcp_init(unaff_RBX,&tcp_handle);
    if (iVar1 != 0) goto LAB_001715bf;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,local_120,connect_cb);
    if (iVar1 != 0) goto LAB_001715c4;
    if (write_cb_called != 0) goto LAB_001715c9;
    if (close_cb_called != 0) goto LAB_001715ce;
    iVar1 = uv_run(unaff_RBX,0);
    if (iVar1 != 0) goto LAB_001715d3;
    printf("%d of %d write reqs seen\n",(ulong)(uint)write_cb_called,0x20);
    if (write_cb_called != 0x20) goto LAB_001715d8;
    if (close_cb_called == 1) {
      unaff_RBX = uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001715e2;
    }
  }
  else {
    run_test_tcp_close_cold_1();
LAB_001715ab:
    run_test_tcp_close_cold_2();
LAB_001715b0:
    run_test_tcp_close_cold_3();
LAB_001715b5:
    run_test_tcp_close_cold_4();
LAB_001715ba:
    run_test_tcp_close_cold_5();
LAB_001715bf:
    run_test_tcp_close_cold_6();
LAB_001715c4:
    run_test_tcp_close_cold_7();
LAB_001715c9:
    run_test_tcp_close_cold_8();
LAB_001715ce:
    run_test_tcp_close_cold_9();
LAB_001715d3:
    run_test_tcp_close_cold_10();
LAB_001715d8:
    run_test_tcp_close_cold_11();
  }
  run_test_tcp_close_cold_12();
LAB_001715e2:
  run_test_tcp_close_cold_13();
  puVar6 = (uv_tcp_t *)0x4;
  uStack_148 = unaff_RBX;
  auStack_158 = uv_buf_init("PING");
  iVar1 = 0x20;
  while( true ) {
    iVar5 = (int)puVar6;
    __ptr = (uv_tcp_t *)0xc0;
    puVar4 = (uv_tcp_t *)malloc(0xc0);
    if (puVar4 == (uv_tcp_t *)0x0) break;
    puVar6 = &tcp_handle;
    iVar2 = uv_write(puVar4,&tcp_handle,auStack_158,1,write_cb);
    iVar5 = (int)puVar6;
    __ptr = puVar4;
    if (iVar2 != 0) goto LAB_00171671;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar1 = uv_close(&tcp_handle,close_cb);
      return iVar1;
    }
  }
  connect_cb_cold_2();
LAB_00171671:
  connect_cb_cold_1();
  if (iVar5 == 0) {
    return extraout_EAX;
  }
  connection_cb_cold_1();
  if (close_cb_called == 0) {
    if ((uv_tcp_t *)__ptr->next_closing == &tcp_handle) {
      write_cb_called = write_cb_called + 1;
      free(__ptr);
      return extraout_EAX_00;
    }
  }
  else {
    write_cb_cold_1();
  }
  write_cb_cold_2();
  if (__ptr == &tcp_handle) {
    close_cb_called = close_cb_called + 1;
    return 0x31d3c8;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(__ptr,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_close) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &tcp_handle);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  printf("%d of %d write reqs seen\n", write_cb_called, NUM_WRITE_REQS);

  ASSERT(write_cb_called == NUM_WRITE_REQS);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}